

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

Constraint *
slang::ast::DisableSoftConstraint::fromSyntax(DisableConstraintSyntax *syntax,ASTContext *context)

{
  SourceRange sourceRange_00;
  bool bVar1;
  int iVar2;
  RandMode RVar3;
  Expression *args;
  undefined4 extraout_var;
  SourceLocation SVar4;
  SourceLocation SVar5;
  Compilation *in_RSI;
  type *sourceRange;
  type *sym;
  DisableSoftConstraint *result;
  Expression *expr;
  Compilation *comp;
  undefined4 in_stack_ffffffffffffff98;
  DiagCode in_stack_ffffffffffffffb4;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffd0;
  DisableSoftConstraint *local_8;
  ASTContext *this;
  
  ASTContext::getCompilation((ASTContext *)0x6d280b);
  args = (Expression *)
         not_null<slang::syntax::ExpressionSyntax_*>::operator*
                   ((not_null<slang::syntax::ExpressionSyntax_*> *)0x6d281e);
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffd0,None);
  iVar2 = Expression::bind((int)args,(sockaddr *)in_RSI,(socklen_t)in_stack_ffffffffffffffd0.m_bits)
  ;
  this = (ASTContext *)CONCAT44(extraout_var,iVar2);
  local_8 = BumpAllocator::emplace<slang::ast::DisableSoftConstraint,slang::ast::Expression_const&>
                      (&in_RSI->super_BumpAllocator,args);
  bVar1 = Expression::bad((Expression *)in_RSI);
  if (bVar1) {
    local_8 = (DisableSoftConstraint *)Constraint::badConstraint(in_RSI,(Constraint *)args);
  }
  else {
    getConstraintPrimary((Expression *)in_stack_ffffffffffffffd0.m_bits);
    SVar4 = (SourceLocation)
            std::get<0ul,slang::ast::Symbol_const*,slang::SourceRange>
                      ((pair<const_slang::ast::Symbol_*,_slang::SourceRange> *)0x6d28ab);
    SVar5 = (SourceLocation)
            std::get<1ul,slang::ast::Symbol_const*,slang::SourceRange>
                      ((pair<const_slang::ast::Symbol_*,_slang::SourceRange> *)0x6d28ba);
    if ((*(long *)SVar4 == 0) ||
       (RVar3 = ASTContext::getRandMode(this,(Symbol *)in_stack_ffffffffffffffd0.m_bits),
       RVar3 != Rand)) {
      sourceRange_00.endLoc = SVar4;
      sourceRange_00.startLoc = SVar5;
      ASTContext::addDiag((ASTContext *)CONCAT44(0x20008,in_stack_ffffffffffffff98),
                          in_stack_ffffffffffffffb4,sourceRange_00);
      local_8 = (DisableSoftConstraint *)Constraint::badConstraint(in_RSI,(Constraint *)args);
    }
  }
  return &local_8->super_Constraint;
}

Assistant:

Constraint& DisableSoftConstraint::fromSyntax(const DisableConstraintSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& expr = Expression::bind(*syntax.name, context);
    auto result = comp.emplace<DisableSoftConstraint>(expr);
    if (expr.bad())
        return badConstraint(comp, result);

    auto [sym, sourceRange] = getConstraintPrimary(expr);
    if (!sym || context.getRandMode(*sym) != RandMode::Rand) {
        context.addDiag(diag::BadDisableSoft, sourceRange);
        return badConstraint(comp, result);
    }

    return *result;
}